

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

int streamProcessTest(char *filename,char *result,char *err,xmlTextReaderPtr reader,char *rng,
                     int options)

{
  int iVar1;
  undefined4 *puVar2;
  FILE *local_50;
  FILE *t;
  char *temp;
  int ret;
  int options_local;
  char *rng_local;
  xmlTextReaderPtr reader_local;
  char *err_local;
  char *result_local;
  char *filename_local;
  
  t = (FILE *)0x0;
  local_50 = (FILE *)0x0;
  if (reader == (xmlTextReaderPtr)0x0) {
    filename_local._4_4_ = -1;
  }
  else {
    nb_tests = nb_tests + 1;
    if (result != (char *)0x0) {
      t = (FILE *)resultFilename(filename,temp_directory,".res");
      if (t == (FILE *)0x0) {
        fprintf(_stderr,"Out of memory\n");
        fatalError();
      }
      local_50 = fopen64((char *)t,"wb");
      if (local_50 == (FILE *)0x0) {
        fprintf(_stderr,"Can\'t open temp file %s\n",t);
        free(t);
        return -1;
      }
    }
    if ((rng == (char *)0x0) || (iVar1 = xmlTextReaderRelaxNGValidate(reader,rng), -1 < iVar1)) {
      puVar2 = (undefined4 *)__xmlGetWarningsDefaultValue();
      *puVar2 = 1;
      temp._0_4_ = xmlTextReaderRead(reader);
      while ((int)temp == 1) {
        if ((local_50 != (FILE *)0x0) && (rng == (char *)0x0)) {
          processNode((FILE *)local_50,reader);
        }
        temp._0_4_ = xmlTextReaderRead(reader);
      }
      if ((int)temp != 0) {
        testErrorHandler((void *)0x0,"%s : failed to parse\n",filename);
      }
      if (rng != (char *)0x0) {
        iVar1 = xmlTextReaderIsValid(reader);
        if (iVar1 == 1) {
          testErrorHandler((void *)0x0,"%s validates\n",filename);
        }
        else {
          testErrorHandler((void *)0x0,"%s fails to validate\n",filename);
        }
      }
      puVar2 = (undefined4 *)__xmlGetWarningsDefaultValue();
      *puVar2 = 0;
      if (local_50 != (FILE *)0x0) {
        fclose(local_50);
        iVar1 = compareFiles((char *)t,result);
        if (t != (FILE *)0x0) {
          unlink((char *)t);
          free(t);
        }
        if (iVar1 != 0) {
          fprintf(_stderr,"Result for %s failed in %s\n",filename,result);
          return -1;
        }
      }
      if ((err == (char *)0x0) ||
         (iVar1 = compareFileMem(err,testErrors,testErrorsSize), iVar1 == 0)) {
        filename_local._4_4_ = 0;
      }
      else {
        fprintf(_stderr,"Error for %s failed\n",filename);
        printf("%s",testErrors);
        filename_local._4_4_ = -1;
      }
    }
    else {
      testErrorHandler((void *)0x0,"Relax-NG schema %s failed to compile\n",rng);
      fclose(local_50);
      if (t != (FILE *)0x0) {
        unlink((char *)t);
        free(t);
      }
      filename_local._4_4_ = 0;
    }
  }
  return filename_local._4_4_;
}

Assistant:

static int
streamProcessTest(const char *filename, const char *result, const char *err,
                  xmlTextReaderPtr reader, const char *rng,
                  int options ATTRIBUTE_UNUSED) {
    int ret;
    char *temp = NULL;
    FILE *t = NULL;

    if (reader == NULL)
        return(-1);

    nb_tests++;
    if (result != NULL) {
	temp = resultFilename(filename, temp_directory, ".res");
	if (temp == NULL) {
	    fprintf(stderr, "Out of memory\n");
	    fatalError();
	}
	t = fopen(temp, "wb");
	if (t == NULL) {
	    fprintf(stderr, "Can't open temp file %s\n", temp);
	    free(temp);
	    return(-1);
	}
    }
#ifdef LIBXML_SCHEMAS_ENABLED
    if (rng != NULL) {
	ret = xmlTextReaderRelaxNGValidate(reader, rng);
	if (ret < 0) {
	    testErrorHandler(NULL, "Relax-NG schema %s failed to compile\n",
	                     rng);
	    fclose(t);
            if (temp != NULL) {
                unlink(temp);
                free(temp);
            }
	    return(0);
	}
    }
#endif
    xmlGetWarningsDefaultValue = 1;
    ret = xmlTextReaderRead(reader);
    while (ret == 1) {
	if ((t != NULL) && (rng == NULL))
	    processNode(t, reader);
        ret = xmlTextReaderRead(reader);
    }
    if (ret != 0) {
        testErrorHandler(NULL, "%s : failed to parse\n", filename);
    }
    if (rng != NULL) {
        if (xmlTextReaderIsValid(reader) != 1) {
	    testErrorHandler(NULL, "%s fails to validate\n", filename);
	} else {
	    testErrorHandler(NULL, "%s validates\n", filename);
	}
    }
    xmlGetWarningsDefaultValue = 0;
    if (t != NULL) {
        fclose(t);
	ret = compareFiles(temp, result);
        if (temp != NULL) {
            unlink(temp);
            free(temp);
        }
	if (ret) {
	    fprintf(stderr, "Result for %s failed in %s\n", filename, result);
	    return(-1);
	}
    }
    if (err != NULL) {
	ret = compareFileMem(err, testErrors, testErrorsSize);
	if (ret != 0) {
	    fprintf(stderr, "Error for %s failed\n", filename);
	    printf("%s", testErrors);
	    return(-1);
	}
    }

    return(0);
}